

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::ASTVisitor<no_legacy_generate::MainVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::PredefinedIntegerType>
          (ASTVisitor<no_legacy_generate::MainVisitor,_true,_true,_false,_false> *this,
          PredefinedIntegerType *t)

{
  DeclaredType *this_00;
  Expression *this_01;
  
  this_00 = Symbol::getDeclaredType((Symbol *)t);
  if (this_00 != (DeclaredType *)0x0) {
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
                (this_01,this_01,(AlwaysFFVisitor *)this);
      return;
    }
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }